

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareFieldValueUsingParentFields
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *field,int index1,int index2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  byte bVar2;
  int iVar3;
  Reflection *this_00;
  Message *pMVar4;
  SpecificField *specific_field;
  string *psVar5;
  string *extraout_RAX;
  bool bVar6;
  Metadata MVar7;
  FieldContext field_context;
  MessageDifferencer MStack_240;
  Reflection *pRStack_90;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *pvStack_88;
  FieldDescriptor *pFStack_80;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  **local_78;
  int local_64;
  Reflection *local_60;
  Reflection *local_58;
  MessageDifferencer *local_50;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *local_48;
  Message local_40;
  
  local_78 = &local_48;
  local_48 = parent_fields;
  pFStack_80 = (FieldDescriptor *)0x31c56b;
  local_64 = unpacked_any;
  iVar3 = (*(((this->field_comparator_).default_impl)->super_SimpleFieldComparator).
            super_FieldComparator._vptr_FieldComparator[2])();
  if ((iVar3 != 2) || (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10)
     ) {
    return iVar3 == 0;
  }
  pFStack_80 = (FieldDescriptor *)0x31c58f;
  local_50 = this;
  MVar7 = Message::GetMetadata(message1);
  this_00 = MVar7.reflection;
  pFStack_80 = (FieldDescriptor *)0x31c59a;
  MVar7 = Message::GetMetadata(message2);
  local_58 = MVar7.reflection;
  bVar2 = field->field_0x1;
  bVar6 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar6) {
    psVar5 = (string *)0x0;
  }
  else {
    pFStack_80 = (FieldDescriptor *)0x31c6fd;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar6,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (psVar5 == (string *)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      pFStack_80 = (FieldDescriptor *)0x31c5da;
      this_00 = (Reflection *)Reflection::GetMessage(this_00,message1,field,(MessageFactory *)0x0);
    }
    else {
      pFStack_80 = (FieldDescriptor *)0x31c5f6;
      this_00 = (Reflection *)Reflection::GetRepeatedMessage(this_00,message1,field,index1);
    }
    bVar2 = field->field_0x1;
    bVar6 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 == bVar6) {
      psVar5 = (string *)0x0;
    }
    else {
      pFStack_80 = (FieldDescriptor *)0x31c719;
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar6,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar5 == (string *)0x0) {
      local_60 = this_00;
      if ((field->field_0x1 & 0x20) == 0) {
        pFStack_80 = (FieldDescriptor *)0x31c63b;
        pMVar4 = Reflection::GetMessage(local_58,message2,field,(MessageFactory *)0x0);
      }
      else {
        pFStack_80 = (FieldDescriptor *)0x31c654;
        pMVar4 = Reflection::GetRepeatedMessage(local_58,message2,field,index2);
      }
      if (parent_fields !=
          (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           *)0x0) {
        pFStack_80 = (FieldDescriptor *)0x31c664;
        specific_field = PushSpecificField(parent_fields);
        specific_field->message1 = message1;
        specific_field->message2 = message2;
        specific_field->unpacked_any = local_64;
        specific_field->field = field;
        pFStack_80 = (FieldDescriptor *)0x31c68a;
        AddSpecificIndex(specific_field,message1,field,index1);
        pFStack_80 = (FieldDescriptor *)0x31c69f;
        AddSpecificNewIndex(specific_field,message2,field,index2);
        pFStack_80 = (FieldDescriptor *)0x31c6be;
        bVar6 = Compare(local_50,(Message *)local_60,pMVar4,0,parent_fields);
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        return bVar6;
      }
      pFStack_80 = (FieldDescriptor *)0x31c6d7;
      bVar6 = Compare(local_50,(Message *)local_60,pMVar4);
      return bVar6;
    }
  }
  else {
    pFStack_80 = (FieldDescriptor *)0x31c72b;
    CompareFieldValueUsingParentFields();
    psVar5 = extraout_RAX;
  }
  pMVar4 = &local_40;
  pFStack_80 = (FieldDescriptor *)Equals;
  CompareFieldValueUsingParentFields();
  pvStack_88 = parent_fields;
  pRStack_90 = this_00;
  pFStack_80 = field;
  MessageDifferencer(&MStack_240);
  bVar6 = Compare(&MStack_240,pMVar4,(Message *)psVar5);
  ~MessageDifferencer(&MStack_240);
  return bVar6;
}

Assistant:

bool MessageDifferencer::CompareFieldValueUsingParentFields(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* field, int index1, int index2,
    std::vector<SpecificField>* parent_fields) {
  FieldContext field_context(parent_fields);
  FieldComparator::ComparisonResult result = GetFieldComparisonResult(
      message1, message2, field, index1, index2, &field_context);

  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      result == FieldComparator::RECURSE) {
    // Get the nested messages and compare them using one of the Compare
    // methods.
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    const Message& m1 =
        field->is_repeated()
            ? reflection1->GetRepeatedMessage(message1, field, index1)
            : reflection1->GetMessage(message1, field);
    const Message& m2 =
        field->is_repeated()
            ? reflection2->GetRepeatedMessage(message2, field, index2)
            : reflection2->GetMessage(message2, field);

    // parent_fields is used in calls to Reporter methods.
    if (parent_fields != NULL) {
      // Append currently compared field to the end of parent_fields.
      SpecificField& specific_field = PushSpecificField(parent_fields);
      specific_field.message1 = &message1;
      specific_field.message2 = &message2;
      specific_field.unpacked_any = unpacked_any;
      specific_field.field = field;
      AddSpecificIndex(&specific_field, message1, field, index1);
      AddSpecificNewIndex(&specific_field, message2, field, index2);
      const bool compare_result = Compare(m1, m2, false, parent_fields);
      parent_fields->pop_back();
      return compare_result;
    } else {
      // Recreates parent_fields as if m1 and m2 had no parents.
      return Compare(m1, m2);
    }
  } else {
    return (result == FieldComparator::SAME);
  }
}